

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O2

void zddPrintCoverAux(DdManager *zdd,DdNode *node,int level,int *list)

{
  DdNode *node_00;
  DdNode *pDVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  
LAB_0074997e:
  uVar3 = (ulong)level;
  do {
    if (*(int *)((ulong)node & 0xfffffffffffffffe) == 0x7fffffff) {
      if (zdd->one != node) {
        return;
      }
      if ((int)uVar3 == zdd->sizeZ) {
        for (lVar6 = 0; lVar6 < (int)uVar3; lVar6 = lVar6 + 2) {
          uVar2 = list[lVar6] * 4 + list[lVar6 + 1];
          iVar5 = 0x40;
          if (uVar2 < 5) {
            iVar5 = *(int *)(&DAT_008e6720 + (ulong)uVar2 * 4);
          }
          putc(iVar5,(FILE *)zdd->out);
          uVar3 = (ulong)(uint)zdd->sizeZ;
        }
        fwrite(" 1\n",3,1,(FILE *)zdd->out);
        return;
      }
    }
    else {
      uVar4 = (ulong)node->index;
      iVar5 = 0x7fffffff;
      if (uVar4 != 0x7fffffff) {
        iVar5 = zdd->permZ[uVar4];
      }
      if ((int)uVar3 == iVar5) break;
    }
    list[zdd->invpermZ[uVar3]] = 0;
    uVar3 = uVar3 + 1;
  } while( true );
  node_00 = (node->type).kids.T;
  pDVar1 = (node->type).kids.E;
  level = iVar5 + 1;
  if (node_00 == pDVar1) {
    list[uVar4] = 2;
    node = pDVar1;
  }
  else {
    list[uVar4] = 1;
    zddPrintCoverAux(zdd,node_00,level,list);
    list[node->index] = 0;
    node = pDVar1;
  }
  goto LAB_0074997e;
}

Assistant:

static void
zddPrintCoverAux(
  DdManager * zdd /* manager */,
  DdNode * node /* current node */,
  int  level /* depth in the recursion */,
  int * list /* current recursion path */)
{
    DdNode      *Nv, *Nnv;
    int         i, v;
    DdNode      *base = DD_ONE(zdd);

    if (Cudd_IsConstant(node)) {
        if (node == base) {
            /* Check for missing variable. */
            if (level != zdd->sizeZ) {
                list[zdd->invpermZ[level]] = 0;
                zddPrintCoverAux(zdd, node, level + 1, list);
                return;
            }
            /* Terminal case: Print one cube based on the current recursion
            ** path.
            */
            for (i = 0; i < zdd->sizeZ; i += 2) {
                v = list[i] * 4 + list[i+1];
                if (v == 0)
                    (void) putc('-',zdd->out);
                else if (v == 4)
                    (void) putc('1',zdd->out);
                else if (v == 1)
                    (void) putc('0',zdd->out);
                else
                    (void) putc('@',zdd->out); /* should never happen */
            }
            (void) fprintf(zdd->out," 1\n");
        }
    } else {
        /* Check for missing variable. */
        if (level != cuddIZ(zdd,node->index)) {
            list[zdd->invpermZ[level]] = 0;
            zddPrintCoverAux(zdd, node, level + 1, list);
            return;
        }

        Nnv = cuddE(node);
        Nv = cuddT(node);
        if (Nv == Nnv) {
            list[node->index] = 2;
            zddPrintCoverAux(zdd, Nnv, level + 1, list);
            return;
        }

        list[node->index] = 1;
        zddPrintCoverAux(zdd, Nv, level + 1, list);
        list[node->index] = 0;
        zddPrintCoverAux(zdd, Nnv, level + 1, list);
    }
    return;

}